

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp)

{
  opj_tcd_band_t *poVar1;
  long lVar2;
  byte *pbVar3;
  float fVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  OPJ_UINT32 OVar9;
  opj_tcd_tilecomp_t *poVar10;
  opj_tccp_t *poVar11;
  opj_tcd_resolution_t *poVar12;
  opj_tcd_precinct_t *poVar13;
  opj_tcd_cblk_enc_t *poVar14;
  int *piVar15;
  opj_mqc_t *mqc;
  flag_t *pfVar16;
  opj_mqc_t *poVar17;
  opj_mqc_t *mqc_00;
  opj_bool oVar18;
  uint uVar19;
  opj_tcd_pass_t *poVar20;
  byte bVar21;
  int level;
  uint uVar22;
  short *psVar23;
  long lVar24;
  uint *puVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  bool bVar34;
  byte bVar35;
  ushort uVar36;
  int *piVar37;
  long lVar38;
  int iVar39;
  int *piVar40;
  opj_tcd_cblk_enc_t *poVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  ulong uVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int iVar52;
  uint uVar53;
  long lVar54;
  bool bVar55;
  bool bVar56;
  float fVar57;
  double dVar58;
  undefined1 auVar59 [16];
  int local_1ac;
  double local_190;
  int local_17c;
  int local_178;
  long local_158;
  ulong local_128;
  long local_118;
  double local_d8;
  long local_c0;
  long local_b8;
  
  tile->distotile = 0.0;
  if (0 < tile->numcomps) {
    local_158 = 0;
    do {
      poVar10 = tile->comps;
      if (0 < poVar10[local_158].numresolutions) {
        iVar6 = poVar10[local_158].x1;
        iVar7 = poVar10[local_158].x0;
        iVar39 = iVar6 - iVar7;
        poVar11 = tcp->tccps;
        lVar29 = 0;
        do {
          poVar12 = poVar10[local_158].resolutions;
          if (0 < poVar12[lVar29].numbands) {
            local_118 = 0;
            do {
              if (0 < poVar12[lVar29].ph * poVar12[lVar29].pw) {
                poVar1 = poVar12[lVar29].bands + local_118;
                fVar57 = floorf(poVar1->stepsize * 8192.0);
                lVar28 = 0;
                do {
                  poVar13 = poVar1->precincts;
                  if (0 < poVar13[lVar28].ch * poVar13[lVar28].cw) {
                    lVar54 = 0;
                    do {
                      poVar14 = poVar13[lVar28].cblks.enc;
                      iVar30 = poVar14[lVar54].x0 - poVar1->x0;
                      if ((poVar1->bandno & 1U) != 0) {
                        iVar30 = (iVar30 + poVar10[local_158].resolutions[lVar29 + -1].x1) -
                                 poVar10[local_158].resolutions[lVar29 + -1].x0;
                      }
                      iVar32 = poVar14[lVar54].y0 - poVar1->y0;
                      if ((poVar1->bandno & 2U) != 0) {
                        iVar32 = (iVar32 + poVar10[local_158].resolutions[lVar29 + -1].y1) -
                                 poVar10[local_158].resolutions[lVar29 + -1].y0;
                      }
                      poVar41 = poVar14 + lVar54;
                      oVar18 = allocate_buffers(t1,poVar41->x1 - poVar14[lVar54].x0,
                                                poVar41->y1 - poVar14[lVar54].y0);
                      if (oVar18 == 0) {
                        return;
                      }
                      piVar15 = t1->data;
                      uVar8 = t1->w;
                      uVar19 = t1->h;
                      piVar37 = poVar10[local_158].data + (iVar32 * iVar39 + iVar30);
                      if (poVar11[local_158].qmfbid == 1) {
                        if (0 < (int)uVar19) {
                          uVar42 = 0;
                          piVar40 = piVar15;
                          do {
                            if (0 < (int)uVar8) {
                              uVar43 = 0;
                              do {
                                piVar40[uVar43] = piVar37[uVar43] << 6;
                                uVar43 = uVar43 + 1;
                              } while (uVar8 != uVar43);
                            }
                            uVar42 = uVar42 + 1;
                            piVar40 = piVar40 + (int)uVar8;
                            piVar37 = piVar37 + iVar39;
                          } while (uVar42 != uVar19);
                        }
                      }
                      else if (0 < (int)uVar19) {
                        uVar42 = 0;
                        piVar40 = piVar15;
                        do {
                          if (0 < (int)uVar8) {
                            uVar43 = 0;
                            do {
                              lVar50 = (long)piVar37[uVar43] *
                                       (long)(int)(0x4000000 / (long)(int)fVar57);
                              piVar40[uVar43] =
                                   (int)((ulong)((uint)lVar50 & 0x1000) + lVar50 >> 0xd) >> 5;
                              uVar43 = uVar43 + 1;
                            } while (uVar8 != uVar43);
                          }
                          uVar42 = uVar42 + 1;
                          piVar40 = piVar40 + (int)uVar8;
                          piVar37 = piVar37 + ((long)iVar6 - (long)iVar7);
                        } while (uVar42 != uVar19);
                      }
                      iVar30 = poVar1->bandno;
                      level = poVar10[local_158].numresolutions + ~(uint)lVar29;
                      uVar8 = poVar11[local_158].cblksty;
                      OVar9 = poVar11[local_158].qmfbid;
                      fVar4 = poVar1->stepsize;
                      iVar32 = tile->numcomps;
                      iVar45 = tcp->mct;
                      uVar27 = t1->h * t1->w;
                      mqc = t1->mqc;
                      uVar19 = 0;
                      if (0 < (int)uVar27) {
                        uVar42 = 0;
                        uVar19 = 0;
                        do {
                          uVar46 = piVar15[uVar42];
                          uVar53 = -uVar46;
                          if (0 < (int)uVar46) {
                            uVar53 = uVar46;
                          }
                          if ((int)uVar19 <= (int)uVar53) {
                            uVar19 = uVar53;
                          }
                          uVar42 = uVar42 + 1;
                        } while (uVar27 != uVar42);
                      }
                      iVar44 = 0;
                      if ((uVar19 != 0) && (iVar44 = -5, 1 < (int)uVar19)) {
                        uVar42 = (ulong)uVar19;
                        do {
                          uVar42 = uVar42 >> 1;
                          iVar44 = iVar44 + 1;
                          bVar34 = 3 < uVar19;
                          uVar19 = (uint)uVar42;
                        } while (bVar34);
                      }
                      poVar41->numbps = iVar44;
                      mqc_resetstates(mqc);
                      lVar50 = 0;
                      mqc_setstate(mqc,0x12,0,0x2e);
                      mqc_setstate(mqc,0x11,0,3);
                      mqc_setstate(mqc,0,0,4);
                      mqc_init_enc(mqc,poVar41->data);
                      if (0 < iVar44) {
                        iVar44 = iVar44 + -1;
                        auVar59._0_4_ = -(uint)((uVar8 & 2) == 0);
                        auVar59._4_4_ = -(uint)((uVar8 & 1) == 0);
                        auVar59._8_4_ = -(uint)((uVar8 & 4) == 0);
                        auVar59._12_4_ = -(uint)((uVar8 & 0x20) == 0);
                        bVar55 = iVar45 != 0;
                        bVar34 = iVar32 == 3 && bVar55;
                        uVar19 = movmskps(CONCAT31((int3)iVar30,bVar55),auVar59);
                        bVar35 = ((byte)uVar19 & 2) >> 1;
                        local_17c = 2;
                        local_d8 = 0.0;
                        lVar50 = 0;
                        do {
                          poVar20 = poVar41->passes + lVar50;
                          bVar26 = (byte)uVar8 & 1;
                          if (poVar41->numbps + -4 <= iVar44) {
                            bVar26 = 0;
                          }
                          if (1 < local_17c) {
                            bVar26 = 0;
                          }
                          bVar21 = (byte)iVar44;
                          if (local_17c == 2) {
                            uVar27 = 0x40 << (bVar21 & 0x1f);
                            if (t1->h < 1) {
                              local_1ac = 0;
                            }
                            else {
                              poVar17 = t1->mqc;
                              psVar23 = lut_nmsedec_sig;
                              if (iVar44 == 0) {
                                psVar23 = lut_nmsedec_sig0;
                              }
                              local_b8 = 0;
                              local_c0 = -3;
                              local_1ac = 0;
                              local_128 = 0;
                              do {
                                uVar42 = (ulong)(uint)t1->w;
                                if (0 < t1->w) {
                                  uVar43 = local_128 | 3;
                                  lVar51 = 0;
                                  lVar31 = 0;
                                  do {
                                    uVar46 = 0;
                                    bVar55 = false;
                                    if ((long)uVar43 < (long)t1->h) {
                                      lVar24 = (long)t1->flags_stride;
                                      pfVar16 = t1->flags;
                                      if ((uVar8 & 8) == 0) {
                                        if ((((pfVar16[(local_128 | 1) * lVar24 + lVar31 + 1] &
                                              0x50ffU) != 0) ||
                                            ((pfVar16[(local_128 | 2) * lVar24 + lVar31 + 1] &
                                             0x50ffU) != 0)) ||
                                           ((pfVar16[uVar43 * lVar24 + lVar31 + 1] & 0x50ffU) != 0))
                                        {
LAB_0013a082:
                                          bVar55 = false;
                                          goto LAB_0013a085;
                                        }
                                        uVar36 = 0x50ff;
                                      }
                                      else {
                                        if ((((pfVar16[(local_128 | 1) * lVar24 + lVar31 + 1] &
                                              0x50ffU) != 0) ||
                                            ((pfVar16[(local_128 | 2) * lVar24 + lVar31 + 1] &
                                             0x50ffU) != 0)) ||
                                           ((pfVar16[uVar43 * lVar24 + lVar31 + 1] & 0x50ffU) != 0))
                                        goto LAB_0013a082;
                                        uVar36 = 0x50b9;
                                      }
                                      bVar55 = (pfVar16[lVar24 * (local_128 + 4) + lVar31 + 1] &
                                               uVar36) == 0;
                                    }
LAB_0013a085:
                                    if (bVar55) {
                                      puVar25 = (uint *)(local_b8 * (int)uVar42 + lVar51 +
                                                        (long)t1->data);
                                      uVar47 = 0;
                                      do {
                                        uVar46 = *puVar25;
                                        uVar53 = -uVar46;
                                        if (0 < (int)uVar46) {
                                          uVar53 = uVar46;
                                        }
                                        if ((uVar53 & uVar27) != 0) goto LAB_0013a0e4;
                                        uVar47 = uVar47 + 1;
                                        puVar25 = puVar25 + (int)uVar42;
                                      } while (uVar47 != 4);
                                      uVar47 = 4;
LAB_0013a0e4:
                                      poVar17->curctx = poVar17->ctxs + 0x11;
                                      uVar46 = (uint)uVar47;
                                      mqc_encode(poVar17,(uint)(uVar46 != 4));
                                      if (uVar46 != 4) {
                                        poVar17->curctx = poVar17->ctxs + 0x12;
                                        mqc_encode(poVar17,(uint)(uVar47 >> 1) & 0x7fffffff);
                                        mqc_encode(poVar17,uVar46 & 1);
                                        goto LAB_0013a15d;
                                      }
                                    }
                                    else {
LAB_0013a15d:
                                      if (uVar46 < 4) {
                                        uVar42 = (ulong)(uVar46 + (int)local_128);
                                        lVar24 = 0;
                                        do {
                                          iVar32 = (int)(uVar42 + lVar24);
                                          if (t1->h <= iVar32) break;
                                          bVar56 = true;
                                          if ((uVar8 & 8) != 0) {
                                            if (local_c0 + uVar42 + lVar24 == 0) {
                                              bVar56 = false;
                                            }
                                            else {
                                              bVar56 = uVar42 + lVar24 != (ulong)(t1->h - 1);
                                            }
                                          }
                                          lVar38 = (long)(int)(uVar46 + (int)local_128 + (int)lVar24
                                                              + 1) * (long)t1->flags_stride;
                                          pfVar16 = t1->flags;
                                          lVar2 = lVar38 * 2 + lVar31 * 2;
                                          piVar15 = t1->data;
                                          lVar49 = (long)iVar32 * (long)t1->w;
                                          mqc_00 = t1->mqc;
                                          uVar33 = (uint)(ushort)pfVar16[lVar31 + lVar38 + 1];
                                          uVar53 = uVar33 & 0xfffffbb9;
                                          if (bVar56) {
                                            uVar53 = uVar33;
                                          }
                                          if ((bool)(bVar55 & lVar24 == 0)) {
LAB_0013a214:
                                            uVar33 = piVar15[lVar31 + lVar49];
                                            uVar22 = -uVar33;
                                            if (0 < (int)uVar33) {
                                              uVar22 = uVar33;
                                            }
                                            local_1ac = local_1ac +
                                                        psVar23[uVar22 >> (bVar21 & 0x1f) & 0x7f];
                                            uVar53 = uVar53 >> 4 & 0xff;
                                            mqc_00->curctx =
                                                 mqc_00->ctxs +
                                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                 [uVar53];
                                            mqc_encode(mqc_00,(int)""[uVar53] ^ uVar33 >> 0x1f);
                                            t1_updateflags(pfVar16 + lVar31 + lVar38 + 1,
                                                           uVar33 >> 0x1f,t1->flags_stride);
                                          }
                                          else if ((*(byte *)((long)pfVar16 + lVar2 + 3) & 0x50) ==
                                                   0) {
                                            mqc_00->curctx =
                                                 mqc_00->ctxs +
                                                 ""[(int)(uVar53 & 0xff | iVar30 << 8)];
                                            uVar33 = piVar15[lVar31 + lVar49];
                                            uVar22 = -uVar33;
                                            if (0 < (int)uVar33) {
                                              uVar22 = uVar33;
                                            }
                                            mqc_encode(mqc_00,(uint)((uVar27 & uVar22) != 0));
                                            if ((uVar22 & uVar27) != 0) goto LAB_0013a214;
                                          }
                                          pbVar3 = (byte *)((long)pfVar16 + lVar2 + 3);
                                          *pbVar3 = *pbVar3 & 0xbf;
                                          lVar2 = uVar42 + lVar24;
                                          lVar24 = lVar24 + 1;
                                        } while (lVar2 + 1U < local_128 + 4);
                                      }
                                    }
                                    lVar31 = lVar31 + 1;
                                    uVar42 = (ulong)t1->w;
                                    lVar51 = lVar51 + 4;
                                  } while (lVar31 < (long)uVar42);
                                }
                                local_128 = local_128 + 4;
                                local_b8 = local_b8 + 0x10;
                                local_c0 = local_c0 + -4;
                              } while ((long)local_128 < (long)t1->h);
                            }
                            if ((byte)((byte)uVar19 >> 3) == 0) {
                              mqc_segmark_enc(mqc);
                            }
                          }
                          else if (local_17c == 1) {
                            if (t1->h < 1) {
LAB_0013a5ee:
                              local_1ac = 0;
                            }
                            else {
                              psVar23 = lut_nmsedec_ref;
                              if (iVar44 == 0) {
                                psVar23 = lut_nmsedec_ref0;
                              }
                              local_1ac = 0;
                              iVar32 = 0;
                              do {
                                if (0 < t1->w) {
                                  iVar45 = 0;
                                  do {
                                    iVar52 = 4;
                                    iVar48 = iVar32;
                                    do {
                                      if (t1->h <= iVar48) break;
                                      bVar55 = true;
                                      if ((uVar8 & 8) != 0) {
                                        if (iVar52 == 1) {
                                          bVar55 = false;
                                        }
                                        else {
                                          bVar55 = iVar48 != t1->h + -1;
                                        }
                                      }
                                      pfVar16 = t1->flags;
                                      lVar31 = (long)(t1->flags_stride * (iVar48 + 1) + iVar45);
                                      uVar36 = pfVar16[lVar31 + 1];
                                      uVar27 = uVar36 & 0xfffffbb9;
                                      if (bVar55) {
                                        uVar27 = (uint)uVar36;
                                      }
                                      if ((uVar27 & 0x5000) == 0x1000) {
                                        uVar46 = t1->data[iVar48 * t1->w + iVar45];
                                        uVar53 = -uVar46;
                                        if (0 < (int)uVar46) {
                                          uVar53 = uVar46;
                                        }
                                        poVar17 = t1->mqc;
                                        uVar42 = (ulong)(0xf - ((char)uVar27 == '\0'));
                                        if ((uVar27 >> 0xd & 1) != 0) {
                                          uVar42 = 0x10;
                                        }
                                        sVar5 = psVar23[uVar53 >> (bVar21 & 0x1f) & 0x7f];
                                        poVar17->curctx = poVar17->ctxs + uVar42;
                                        uVar27 = (uint)((0x40 << (bVar21 & 0x1f) & uVar53) != 0);
                                        if (bVar26 == 0) {
                                          mqc_encode(poVar17,uVar27);
                                        }
                                        else {
                                          mqc_bypass_enc(poVar17,uVar27);
                                        }
                                        local_1ac = local_1ac + sVar5;
                                        pbVar3 = (byte *)((long)pfVar16 + lVar31 * 2 + 3);
                                        *pbVar3 = *pbVar3 | 0x20;
                                      }
                                      iVar52 = iVar52 + -1;
                                      iVar48 = iVar48 + 1;
                                    } while (iVar52 != 0);
                                    iVar45 = iVar45 + 1;
                                  } while (iVar45 < t1->w);
                                }
                                iVar32 = iVar32 + 4;
                              } while (iVar32 < t1->h);
                            }
                          }
                          else {
                            if (t1->h < 1) goto LAB_0013a5ee;
                            psVar23 = lut_nmsedec_sig;
                            if (iVar44 == 0) {
                              psVar23 = lut_nmsedec_sig0;
                            }
                            local_1ac = 0;
                            local_178 = 0;
                            do {
                              if (0 < t1->w) {
                                iVar32 = 0;
                                do {
                                  iVar48 = 4;
                                  iVar45 = local_178;
                                  do {
                                    if (t1->h <= iVar45) break;
                                    bVar55 = true;
                                    if ((uVar8 & 8) != 0) {
                                      if (iVar48 == 1) {
                                        bVar55 = false;
                                      }
                                      else {
                                        bVar55 = iVar45 != t1->h + -1;
                                      }
                                    }
                                    pfVar16 = t1->flags;
                                    lVar31 = (long)(t1->flags_stride * (iVar45 + 1) + iVar32);
                                    uVar27 = (ushort)pfVar16[lVar31 + 1] & 0xfffffbb9;
                                    if (bVar55) {
                                      uVar27 = (uint)(ushort)pfVar16[lVar31 + 1];
                                    }
                                    if ((uVar27 & 0x5000) == 0 && (uVar27 & 0xff) != 0) {
                                      poVar17 = t1->mqc;
                                      piVar15 = t1->data;
                                      iVar52 = iVar45 * t1->w + iVar32;
                                      uVar46 = piVar15[iVar52];
                                      uVar53 = -uVar46;
                                      if (0 < (int)uVar46) {
                                        uVar53 = uVar46;
                                      }
                                      uVar53 = uVar53 & 0x40 << (bVar21 & 0x1f);
                                      poVar17->curctx =
                                           poVar17->ctxs + ""[(int)(uVar27 & 0xff | iVar30 << 8)];
                                      uVar46 = (uint)(uVar53 != 0);
                                      if (bVar26 == 0) {
                                        mqc_encode(poVar17,uVar46);
                                      }
                                      else {
                                        mqc_bypass_enc(poVar17,uVar46);
                                      }
                                      if (uVar53 != 0) {
                                        uVar46 = piVar15[iVar52];
                                        uVar33 = uVar46 >> 0x1f;
                                        uVar53 = -uVar46;
                                        if (0 < (int)uVar46) {
                                          uVar53 = uVar46;
                                        }
                                        sVar5 = psVar23[uVar53 >> (bVar21 & 0x1f) & 0x7f];
                                        uVar42 = (ulong)(uVar27 >> 4) & 0xff;
                                        poVar17->curctx =
                                             poVar17->ctxs +
                                             "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                             [uVar42];
                                        if (bVar26 == 0) {
                                          mqc_encode(poVar17,(int)""[uVar42] ^ uVar33);
                                        }
                                        else {
                                          mqc_bypass_enc(poVar17,uVar33);
                                        }
                                        local_1ac = local_1ac + sVar5;
                                        t1_updateflags(pfVar16 + lVar31 + 1,uVar33,t1->flags_stride)
                                        ;
                                      }
                                      pbVar3 = (byte *)((long)pfVar16 + lVar31 * 2 + 3);
                                      *pbVar3 = *pbVar3 | 0x40;
                                    }
                                    iVar48 = iVar48 + -1;
                                    iVar45 = iVar45 + 1;
                                  } while (iVar48 != 0);
                                  iVar32 = iVar32 + 1;
                                } while (iVar32 < t1->w);
                              }
                              local_178 = local_178 + 4;
                            } while (local_178 < t1->h);
                          }
                          if (OVar9 == 1) {
                            local_190 = 1.0;
                            if (bVar34) {
                              local_190 = mct_getnorm((int)local_158);
                            }
                            dVar58 = dwt_getnorm(level,iVar30);
                          }
                          else {
                            local_190 = 1.0;
                            if (bVar34) {
                              local_190 = mct_getnorm_real((int)local_158);
                            }
                            dVar58 = dwt_getnorm_real(level,iVar30);
                          }
                          dVar58 = (double)(1 << (bVar21 & 0x1f)) *
                                   dVar58 * (double)fVar4 * local_190;
                          dVar58 = dVar58 * dVar58 * (double)local_1ac * 0.0001220703125;
                          tile->distotile = tile->distotile + dVar58;
                          if (((uVar19 & 4) == 0) && (local_17c != 2 || iVar44 != 0)) {
LAB_0013a6fb:
                            mqc_flush(mqc);
                            iVar32 = 1;
                            iVar45 = 1;
                          }
                          else {
                            iVar32 = poVar41->numbps + -4;
                            if ((local_17c < 1) || (iVar32 <= iVar44)) {
                              if ((local_17c != 2 || iVar32 != iVar44) || bVar35 != 0)
                              goto LAB_0013a729;
                              goto LAB_0013a6fb;
                            }
                            if (bVar35 == 0) goto LAB_0013a6fb;
LAB_0013a729:
                            iVar45 = 3;
                            iVar32 = 0;
                          }
                          poVar20->term = iVar32;
                          local_17c = local_17c + 1;
                          bVar55 = local_17c == 3;
                          if (bVar55) {
                            local_17c = 0;
                          }
                          iVar44 = iVar44 - (uint)bVar55;
                          if ((iVar32 != 0) && (0 < iVar44)) {
                            if ((local_17c < 2 && bVar35 == 0) && iVar44 < poVar41->numbps + -4) {
                              mqc_bypass_init_enc(mqc);
                            }
                            else {
                              mqc_restart_init_enc(mqc);
                            }
                          }
                          local_d8 = local_d8 + dVar58;
                          poVar20->distortiondec = local_d8;
                          iVar32 = mqc_numbytes(mqc);
                          poVar20->rate = iVar32 + iVar45;
                          if ((uVar19 & 1) == 0) {
                            mqc_reset_enc(mqc);
                          }
                          lVar50 = lVar50 + 1;
                        } while (-1 < iVar44);
                      }
                      if ((uVar8 & 0x10) == 0) {
                        if ((uVar8 & 1) == 0) {
                          mqc_flush(mqc);
                        }
                      }
                      else {
                        mqc_erterm_enc(mqc);
                      }
                      poVar41->totalpasses = (int)lVar50;
                      if (0 < (int)lVar50) {
                        lVar50 = 0;
                        lVar31 = 0;
                        do {
                          poVar20 = poVar41->passes;
                          iVar30 = *(int *)((long)&poVar20->rate + lVar50);
                          iVar32 = mqc_numbytes(mqc);
                          if (iVar32 < iVar30) {
                            iVar30 = mqc_numbytes(mqc);
                            *(int *)((long)&poVar20->rate + lVar50) = iVar30;
                          }
                          iVar30 = *(int *)((long)&poVar20->rate + lVar50);
                          if ((1 < (long)iVar30) && (poVar41->data[(long)iVar30 + -1] == 0xff)) {
                            *(int *)((long)&poVar20->rate + lVar50) = iVar30 + -1;
                          }
                          if (lVar50 == 0) {
                            iVar30 = 0;
                          }
                          else {
                            iVar30 = *(int *)((long)&poVar41->passes[-1].rate + lVar50);
                          }
                          *(int *)((long)&poVar20->len + lVar50) =
                               *(int *)((long)&poVar20->rate + lVar50) - iVar30;
                          lVar31 = lVar31 + 1;
                          lVar50 = lVar50 + 0x18;
                        } while (lVar31 < poVar41->totalpasses);
                      }
                      lVar54 = lVar54 + 1;
                    } while (lVar54 < (long)poVar13[lVar28].ch * (long)poVar13[lVar28].cw);
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 < (long)poVar12[lVar29].ph * (long)poVar12[lVar29].pw);
              }
              local_118 = local_118 + 1;
            } while (local_118 < poVar12[lVar29].numbands);
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 < poVar10[local_158].numresolutions);
      }
      local_158 = local_158 + 1;
    } while (local_158 < tile->numcomps);
  }
  return;
}

Assistant:

void t1_encode_cblks(
		opj_t1_t *t1,
		opj_tcd_tile_t *tile,
		opj_tcp_t *tcp)
{
	int compno, resno, bandno, precno, cblkno;

	tile->distotile = 0;		/* fixed_quality */

	for (compno = 0; compno < tile->numcomps; ++compno) {
		opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
		opj_tccp_t* tccp = &tcp->tccps[compno];
		int tile_w = tilec->x1 - tilec->x0;

		for (resno = 0; resno < tilec->numresolutions; ++resno) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];

			for (bandno = 0; bandno < res->numbands; ++bandno) {
				opj_tcd_band_t* restrict band = &res->bands[bandno];
        int bandconst = 8192 * 8192 / ((int) floor(band->stepsize * 8192));

				for (precno = 0; precno < res->pw * res->ph; ++precno) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];

					for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
						opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
						int* restrict datap;
						int* restrict tiledp;
						int cblk_w;
						int cblk_h;
						int i, j;

						int x = cblk->x0 - band->x0;
						int y = cblk->y0 - band->y0;
						if (band->bandno & 1) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							x += pres->x1 - pres->x0;
						}
						if (band->bandno & 2) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							y += pres->y1 - pres->y0;
						}

						if(!allocate_buffers(
									t1,
									cblk->x1 - cblk->x0,
									cblk->y1 - cblk->y0))
						{
							return;
						}

						datap=t1->data;
						cblk_w = t1->w;
						cblk_h = t1->h;

						tiledp=&tilec->data[(y * tile_w) + x];
						if (tccp->qmfbid == 1) {
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] = tmp << T1_NMSEDEC_FRACBITS;
								}
							}
						} else {		/* if (tccp->qmfbid == 0) */
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] =
										fix_mul(
										tmp,
										bandconst) >> (11 - T1_NMSEDEC_FRACBITS);
								}
							}
						}

						t1_encode_cblk(
								t1,
								cblk,
								band->bandno,
								compno,
								tilec->numresolutions - 1 - resno,
								tccp->qmfbid,
								band->stepsize,
								tccp->cblksty,
								tile->numcomps,
								tcp->mct,
								tile);

					} /* cblkno */
				} /* precno */
			} /* bandno */
		} /* resno  */
	} /* compno  */
}